

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllocationPolicyManager.h
# Opt level: O2

void __thiscall
AllocationPolicyManager::ReportFailure(AllocationPolicyManager *this,size_t byteCount)

{
  AutoCriticalSection local_20;
  AutoCriticalSection auto_cs;
  
  if (this[0x10] == (AllocationPolicyManager)0x1) {
    local_20.cs = (CriticalSection *)(this + 0x18);
    CCLock::Enter((CCLock *)local_20.cs);
    ReportFreeImpl(this,MemoryFailure,byteCount);
    AutoCriticalSection::~AutoCriticalSection(&local_20);
    return;
  }
  ReportFreeImpl(this,MemoryFailure,byteCount);
  return;
}

Assistant:

void ReportFailure(size_t byteCount)
    {
        if (supportConcurrency)
        {
            AutoCriticalSection auto_cs(&cs);
            ReportFreeImpl(MemoryAllocateEvent::MemoryFailure, byteCount);
        }
        else
        {
            ReportFreeImpl(MemoryAllocateEvent::MemoryFailure, byteCount);
        }

    }